

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgen.cc
# Opt level: O0

int main(int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  reference pvVar4;
  DisposeAST local_368;
  DisposeAST disposeAST;
  GenParser gen;
  ofstream out;
  Grammar *local_120;
  Grammar *grammar;
  undefined1 local_100 [8];
  Parser parser;
  undefined1 local_b0 [8];
  vector<Token,_std::allocator<Token>_> tokens;
  vector<Token,_std::allocator<Token>_> verbatim;
  string local_78;
  allocator<char> local_41;
  string local_40;
  FlagsScope local_19;
  char **ppcStack_18;
  FlagsScope flagsScope;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"1.0",&local_41);
  gflags::SetVersionString(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"pgen [options] file",
             (allocator<char> *)
             ((long)&verbatim.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  gflags::SetUsageMessage(&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&verbatim.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  gflags::ParseCommandLineFlags((int *)&argv_local,&stack0xffffffffffffffe8,true);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) && (1 < (int)argv_local)) {
    std::__cxx11::string::operator=((string *)fLS::FLAGS_input_abi_cxx11_,ppcStack_18[1]);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::vector<Token,_std::allocator<Token>_>::vector
                ((vector<Token,_std::allocator<Token>_> *)
                 &tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      anon_unknown.dwarf_5e9cc::ReadFile((string *)&parser.yydepth,fLS::FLAGS_input_abi_cxx11_);
      Lexer::tokenize((vector<Token,_std::allocator<Token>_> *)local_b0,(string *)&parser.yydepth,
                      (vector<Token,_std::allocator<Token>_> *)
                      &tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&parser.yydepth);
      std::vector<Token,_std::allocator<Token>_>::vector
                ((vector<Token,_std::allocator<Token>_> *)&grammar,
                 (vector<Token,_std::allocator<Token>_> *)local_b0);
      Parser::Parser((Parser *)local_100,(vector<Token,_std::allocator<Token>_> *)&grammar);
      std::vector<Token,_std::allocator<Token>_>::~vector
                ((vector<Token,_std::allocator<Token>_> *)&grammar);
      local_120 = (Grammar *)0x0;
      bVar1 = Parser::parse_grammar((Parser *)local_100,&local_120);
      args = fLS::FLAGS_input_abi_cxx11_;
      if (bVar1) {
        bVar1 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&local_120->undef);
        if (bVar1) {
          std::ofstream::ofstream(&gen.verbatim_,fLS::FLAGS_o_abi_cxx11_,0x10);
          GenParser::GenParser((GenParser *)&disposeAST,(ostream *)&gen.verbatim_);
          GenParser::operator()
                    ((GenParser *)&disposeAST,local_120,
                     (vector<Token,_std::allocator<Token>_> *)
                     &tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          ast::DisposeAST::DisposeAST(&local_368);
          ast::DisposeAST::operator()(&local_368,&local_120->super_Node);
          argv_local._4_4_ = 0;
          verbatim.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._0_4_ = 1;
          ast::DisposeAST::~DisposeAST(&local_368);
          GenParser::~GenParser((GenParser *)&disposeAST);
          std::ofstream::~ofstream(&gen.verbatim_);
        }
        else {
          argv_local._4_4_ = 1;
          verbatim.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._0_4_ = 1;
        }
      }
      else {
        pvVar4 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           ((vector<Token,_std::allocator<Token>_> *)local_b0,
                            (ulong)(uint)parser.yytok);
        fmt::v7::print<char[33],std::__cxx11::string&,int&,char>
                  ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
                   (char (*) [33])"{0}:{1}: error: unexpected token",args,&pvVar4->line);
        std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
        verbatim.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 1;
      }
      Parser::~Parser((Parser *)local_100);
      std::vector<Token,_std::allocator<Token>_>::~vector
                ((vector<Token,_std::allocator<Token>_> *)local_b0);
      std::vector<Token,_std::allocator<Token>_>::~vector
                ((vector<Token,_std::allocator<Token>_> *)
                 &tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"pgen: no output file");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      verbatim.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"pgen: no input file");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    verbatim.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
  }
  FlagsScope::~FlagsScope(&local_19);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
  FlagsScope flagsScope;

  gflags::SetVersionString("1.0");
  gflags::SetUsageMessage("pgen [options] file");
  gflags::ParseCommandLineFlags(&argc, &argv, true);

  if (FLAGS_input.empty() && argc > 1) FLAGS_input = argv[1];

  if (FLAGS_input.empty()) {
    std::cerr << "pgen: no input file" << std::endl;
    return EXIT_FAILURE;
  }

  if (FLAGS_o.empty()) {
    std::cerr << "pgen: no output file" << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<Token> verbatim;

  std::vector<Token> tokens = Lexer::tokenize(ReadFile(FLAGS_input), &verbatim);

  Parser parser(tokens);

  ast::Grammar* grammar = nullptr;
  if (!parser.parse_grammar(grammar)) {
    fmt::print(std::cerr, "{0}:{1}: error: unexpected token", FLAGS_input,
               tokens[parser.yycursor].line);
    std::cerr << std::endl;
    return EXIT_FAILURE;
  }

  if (!grammar->undef.empty()) {
    return EXIT_FAILURE;
  }

  std::ofstream out(FLAGS_o);

  GenParser gen(out);
  gen(grammar, verbatim);

  ast::DisposeAST disposeAST;
  disposeAST(grammar);

  return EXIT_SUCCESS;
}